

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O3

void flatcc_json_printer_enum_flag(flatcc_json_printer_t *ctx,int count,char *symbol,size_t len)

{
  char *__dest;
  size_t __n;
  char *pcVar1;
  
  *ctx->p = ' ';
  __dest = ctx->p + (0 < count);
  ctx->p = __dest;
  pcVar1 = ctx->pflush;
  if (pcVar1 <= __dest + len) {
    if (pcVar1 <= __dest) {
      (*ctx->flush)(ctx,0);
      pcVar1 = ctx->pflush;
      __dest = ctx->p;
    }
    __n = (long)pcVar1 - (long)__dest;
    if (__n < len) {
      do {
        memcpy(__dest,symbol,__n);
        ctx->p = ctx->p + __n;
        symbol = symbol + __n;
        len = len - __n;
        (*ctx->flush)(ctx,0);
        __dest = ctx->p;
        __n = (long)ctx->pflush - (long)__dest;
      } while (__n < len);
    }
  }
  memcpy(__dest,symbol,len);
  ctx->p = ctx->p + len;
  return;
}

Assistant:

void flatcc_json_printer_enum_flag(flatcc_json_printer_t *ctx, int count, const char *symbol, size_t len)
{
    *ctx->p = ' ';
    ctx->p += count > 0;
    print(ctx, symbol, len);
}